

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O2

bool private_ACUtils_ADynArray_prepareInsertion
               (void *dynArray,size_t index,size_t valueCount,size_t typeSize)

{
  ulong uVar1;
  bool bVar2;
  void *__src;
  
  if (valueCount == 0 || dynArray == (void *)0x0) {
    bVar2 = (bool)(valueCount == 0);
  }
  else {
    uVar1 = *(ulong *)((long)dynArray + 0x18);
    bVar2 = private_ACUtils_ADynArray_reserve(dynArray,valueCount + uVar1,false,typeSize);
    if (uVar1 < index || uVar1 - index == 0) {
      if (bVar2 == false) {
        return false;
      }
    }
    else {
      if (bVar2 == false) {
        return false;
      }
      __src = (void *)(index * typeSize + *(long *)((long)dynArray + 0x28));
      memmove((void *)(typeSize * valueCount + (long)__src),__src,(uVar1 - index) * typeSize);
    }
    *(long *)((long)dynArray + 0x18) = *(long *)((long)dynArray + 0x18) + valueCount;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

ACUTILS_HD_FUNC bool private_ACUtils_ADynArray_prepareInsertion(void* dynArray, size_t index, size_t valueCount, size_t typeSize)
{
    if(dynArray != NULL && valueCount > 0) {
        struct private_ACUtils_DynArray_Prototype* prototype = (struct private_ACUtils_DynArray_Prototype*) dynArray;
        if(index >= prototype->size) {
            if(!private_ACUtils_ADynArray_reserve(dynArray, prototype->size + valueCount, false, typeSize))
                return false;
        } else if(!private_ACUtils_DynArray_shiftElements(dynArray, index, valueCount, typeSize)) {
            return false;
        }
        prototype->size += valueCount;
        return true;
    }
    return valueCount == 0;
}